

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::ReverseHelper<unsigned_long>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              unsigned_long length,ScriptContext *scriptContext)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  uint uVar5;
  int iVar6;
  BOOL BVar7;
  BOOL BVar8;
  ThreadContext *pTVar9;
  undefined4 *puVar10;
  Recycler *recycler_00;
  SparseArraySegmentBase **ppSVar11;
  SparseArraySegmentBase *pSVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  uint64 index;
  bool bVar13;
  byte local_131;
  unsigned_long upper_2;
  unsigned_long lower_2;
  uint32 upper_1;
  uint32 lower_1;
  uint32 upper;
  uint32 lower;
  SparseArraySegmentBase *seg;
  AutoDisableInterrupt failFastOnError;
  bool isFloatArray;
  bool isIntArray;
  SparseArraySegmentBase *nextSeg;
  SparseArraySegmentBase *prevSeg;
  Recycler *recycler;
  undefined1 local_b0 [7];
  bool useNoSideEffectReverse;
  ThrowTypeErrorOnFailureHelper h;
  char16_t *pcStack_98;
  bool isTypedArrayEntryPoint;
  char16 *methodName;
  unsigned_long upperExists;
  unsigned_long lowerExists;
  Var upperValue;
  Var lowerValue;
  unsigned_long middle;
  undefined1 local_58 [8];
  JsReentLock jsReentLock;
  ScriptContext *scriptContext_local;
  unsigned_long length_local;
  RecyclableObject *obj_local;
  TypedArrayBase *typedArrayBase_local;
  JavascriptArray *pArr_local;
  
  jsReentLock._24_8_ = scriptContext;
  pTVar9 = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_58,pTVar9);
  JsReentLock::setObjectForMutation((JsReentLock *)local_58,pArr);
  lowerValue = (Var)(length >> 1);
  upperValue = (Var)0x0;
  lowerExists = 0;
  h.m_functionName._7_1_ = typedArrayBase != (TypedArrayBase *)0x0;
  obj_local = (RecyclableObject *)typedArrayBase;
  if ((bool)h.m_functionName._7_1_) {
    pcStack_98 = L"[TypedArray].prototype.reverse";
  }
  else {
    pcStack_98 = L"Array.prototype.reverse";
    if ((pArr == (JavascriptArray *)0x0) &&
       (bVar3 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(obj), bVar3)) {
      obj_local = (RecyclableObject *)UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(obj);
    }
  }
  ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailureHelper
            ((ThrowTypeErrorOnFailureHelper *)local_b0,(ScriptContext *)jsReentLock._24_8_,
             pcStack_98);
  local_131 = 0;
  if (pArr != (JavascriptArray *)0x0) {
    bVar3 = HasAnyES5ArrayInPrototypeChain(pArr,false);
    local_131 = bVar3 ^ 0xff;
  }
  scriptContext_local._0_4_ = (uint32)length;
  pArr_local = (JavascriptArray *)obj;
  if ((local_131 & 1) == 0) {
    if ((obj_local == (RecyclableObject *)0x0) || (0xffffffff < length)) {
      for (upper_2 = 0; upper_2 < lowerValue; upper_2 = upper_2 + 1) {
        index = ~upper_2 + length;
        JsReentLock::unlock((JsReentLock *)local_58);
        BVar7 = Js::JavascriptOperators::HasItem(obj,upper_2);
        bVar3 = false;
        if (BVar7 != 0) {
          BVar7 = Js::JavascriptOperators::GetItem
                            (obj,upper_2,&upperValue,(ScriptContext *)jsReentLock._24_8_);
          bVar3 = BVar7 != 0;
        }
        BVar7 = Js::JavascriptOperators::HasItem(obj,index);
        bVar13 = false;
        if (BVar7 != 0) {
          BVar7 = Js::JavascriptOperators::GetItem
                            (obj,index,(Var *)&lowerExists,(ScriptContext *)jsReentLock._24_8_);
          bVar13 = BVar7 != 0;
        }
        JsReentLock::MutateArrayObject((JsReentLock *)local_58);
        JsReentLock::relock((JsReentLock *)local_58);
        if (bVar3) {
          if (bVar13) {
            JsReentLock::unlock((JsReentLock *)local_58);
            BVar7 = Js::JavascriptOperators::SetItem
                              (obj,obj,upper_2,(Var)lowerExists,(ScriptContext *)jsReentLock._24_8_,
                               PropertyOperation_ThrowIfNotExtensible);
            ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                      ((ThrowTypeErrorOnFailureHelper *)local_b0,BVar7);
            BVar7 = Js::JavascriptOperators::SetItem
                              (obj,obj,index,upperValue,(ScriptContext *)jsReentLock._24_8_,
                               PropertyOperation_ThrowIfNotExtensible);
            ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                      ((ThrowTypeErrorOnFailureHelper *)local_b0,BVar7);
            JsReentLock::MutateArrayObject((JsReentLock *)local_58);
            JsReentLock::relock((JsReentLock *)local_58);
          }
          else {
            JsReentLock::unlock((JsReentLock *)local_58);
            BVar7 = Js::JavascriptOperators::DeleteItem
                              (obj,upper_2,PropertyOperation_ThrowOnDeleteIfNotConfig);
            ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                      ((ThrowTypeErrorOnFailureHelper *)local_b0,BVar7);
            BVar7 = Js::JavascriptOperators::SetItem
                              (obj,obj,index,upperValue,(ScriptContext *)jsReentLock._24_8_,
                               PropertyOperation_ThrowIfNotExtensible);
            ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                      ((ThrowTypeErrorOnFailureHelper *)local_b0,BVar7);
            JsReentLock::MutateArrayObject((JsReentLock *)local_58);
            JsReentLock::relock((JsReentLock *)local_58);
          }
        }
        else if (bVar13) {
          JsReentLock::unlock((JsReentLock *)local_58);
          BVar7 = Js::JavascriptOperators::SetItem
                            (obj,obj,upper_2,(Var)lowerExists,(ScriptContext *)jsReentLock._24_8_,
                             PropertyOperation_ThrowIfNotExtensible);
          ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                    ((ThrowTypeErrorOnFailureHelper *)local_b0,BVar7);
          BVar7 = Js::JavascriptOperators::DeleteItem
                            (obj,index,PropertyOperation_ThrowOnDeleteIfNotConfig);
          ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                    ((ThrowTypeErrorOnFailureHelper *)local_b0,BVar7);
          JsReentLock::MutateArrayObject((JsReentLock *)local_58);
          JsReentLock::relock((JsReentLock *)local_58);
        }
      }
    }
    else {
      uVar4 = ArrayObject::GetLength((ArrayObject *)obj_local);
      if (uVar4 == length) {
        for (lower_1 = 0; lower_1 < (uint)lowerValue; lower_1 = lower_1 + 1) {
          uVar5 = ~lower_1 + (uint32)scriptContext_local;
          iVar6 = (*(obj_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x72])(obj_local,(ulong)lower_1);
          upperValue = (Var)CONCAT44(extraout_var,iVar6);
          iVar6 = (*(obj_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x72])(obj_local,(ulong)uVar5);
          lowerExists = CONCAT44(extraout_var_00,iVar6);
          RecyclableObject::HasItem(obj_local,lower_1);
          RecyclableObject::HasItem(obj_local,uVar5);
          JsReentLock::unlock((JsReentLock *)local_58);
          iVar6 = (*(obj_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x70])(obj_local,(ulong)lower_1,lowerExists);
          ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                    ((ThrowTypeErrorOnFailureHelper *)local_b0,iVar6);
          iVar6 = (*(obj_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x70])(obj_local,(ulong)uVar5,upperValue);
          ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                    ((ThrowTypeErrorOnFailureHelper *)local_b0,iVar6);
          JsReentLock::MutateArrayObject((JsReentLock *)local_58);
          JsReentLock::relock((JsReentLock *)local_58);
        }
      }
      else {
        if ((Var)0xffffffff < lowerValue) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x16c4,"(middle <= 0xffffffff)","middle <= UINT_MAX");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 0;
        }
        for (lower_2._4_4_ = 0; lower_2._4_4_ < (uint)lowerValue; lower_2._4_4_ = lower_2._4_4_ + 1)
        {
          uVar5 = ~lower_2._4_4_ + (uint32)scriptContext_local;
          iVar6 = (*(obj_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x72])(obj_local,(ulong)lower_2._4_4_);
          upperValue = (Var)CONCAT44(extraout_var_01,iVar6);
          iVar6 = (*(obj_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x72])(obj_local,(ulong)uVar5);
          lowerExists = CONCAT44(extraout_var_02,iVar6);
          BVar7 = RecyclableObject::HasItem(obj_local,lower_2._4_4_);
          BVar8 = RecyclableObject::HasItem(obj_local,uVar5);
          if (BVar7 == 0) {
            if (BVar8 != 0) {
              JsReentLock::unlock((JsReentLock *)local_58);
              iVar6 = (*(obj_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                        _vptr_IRecyclerVisitedObject[0x70])
                                (obj_local,(ulong)lower_2._4_4_,lowerExists);
              ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                        ((ThrowTypeErrorOnFailureHelper *)local_b0,iVar6);
              JsReentLock::MutateArrayObject((JsReentLock *)local_58);
              JsReentLock::relock((JsReentLock *)local_58);
              iVar6 = (*(obj_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                        _vptr_IRecyclerVisitedObject[0x2a])(obj_local,(ulong)uVar5,0x400);
              ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                        ((ThrowTypeErrorOnFailureHelper *)local_b0,iVar6);
            }
          }
          else if (BVar8 == 0) {
            iVar6 = (*(obj_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[0x2a])(obj_local,(ulong)lower_2._4_4_,0x400);
            ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                      ((ThrowTypeErrorOnFailureHelper *)local_b0,iVar6);
            JsReentLock::unlock((JsReentLock *)local_58);
            iVar6 = (*(obj_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[0x70])(obj_local,(ulong)uVar5,upperValue);
            ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                      ((ThrowTypeErrorOnFailureHelper *)local_b0,iVar6);
            JsReentLock::MutateArrayObject((JsReentLock *)local_58);
            JsReentLock::relock((JsReentLock *)local_58);
          }
          else {
            JsReentLock::unlock((JsReentLock *)local_58);
            iVar6 = (*(obj_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[0x70])
                              (obj_local,(ulong)lower_2._4_4_,lowerExists);
            ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                      ((ThrowTypeErrorOnFailureHelper *)local_b0,iVar6);
            iVar6 = (*(obj_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[0x70])(obj_local,(ulong)uVar5,upperValue);
            ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                      ((ThrowTypeErrorOnFailureHelper *)local_b0,iVar6);
            JsReentLock::MutateArrayObject((JsReentLock *)local_58);
            JsReentLock::relock((JsReentLock *)local_58);
          }
        }
      }
    }
    goto LAB_010f1df4;
  }
  if (0xffffffff < length) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1614,"(length <= JavascriptArray::MaxArrayLength)",
                                "length <= JavascriptArray::MaxArrayLength");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  recycler_00 = ScriptContext::GetRecycler((ScriptContext *)jsReentLock._24_8_);
  pArr_local = pArr;
  if (length < 2) goto LAB_010f1df4;
  bVar3 = IsFillFromPrototypes(pArr);
  if (bVar3) {
    if ((length & 1) == 0) {
      FillFromPrototypes(pArr,0,(uint32)scriptContext_local);
    }
    else {
      lowerValue = (Var)(length >> 1);
      FillFromPrototypes(pArr,0,(uint32)lowerValue);
      FillFromPrototypes(pArr,(uint32)lowerValue + 1,(uint32)scriptContext_local);
    }
  }
  if (length != (pArr->super_ArrayObject).length) {
    Throw::FatalInternalError(-0x7fffbffb);
  }
  bVar3 = HasNoMissingValues(pArr);
  if ((bVar3) &&
     (ppSVar11 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                           ((WriteBarrierPtr *)&pArr->head),
     *ppSVar11 != (SparseArraySegmentBase *)0x0)) {
    pSVar12 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&pArr->head);
    ppSVar11 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                         ((WriteBarrierPtr *)&pSVar12->next);
    if (*ppSVar11 != (SparseArraySegmentBase *)0x0) {
      SetHasNoMissingValues(pArr,false);
    }
  }
  uVar5 = (pArr->super_ArrayObject).length;
  nextSeg = (SparseArraySegmentBase *)0x0;
  failFastOnError._15_1_ = 0;
  failFastOnError._14_1_ = 0;
  ClearSegmentMap(pArr);
  bVar3 = VarIs<Js::JavascriptNativeIntArray,Js::JavascriptArray>(pArr);
  if (bVar3) {
    failFastOnError._15_1_ = 1;
  }
  else {
    bVar3 = VarIs<Js::JavascriptNativeFloatArray,Js::JavascriptArray>(pArr);
    if (bVar3) {
      failFastOnError._14_1_ = 1;
    }
  }
  pTVar9 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
  AutoDisableInterrupt::AutoDisableInterrupt((AutoDisableInterrupt *)&seg,pTVar9,true);
  ppSVar11 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                       ((WriteBarrierPtr *)&pArr->head);
  if (*ppSVar11 != (SparseArraySegmentBase *)0x0) {
    pSVar12 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&pArr->head);
    ppSVar11 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                         ((WriteBarrierPtr *)&pSVar12->next);
    if (*ppSVar11 == (SparseArraySegmentBase *)0x0) {
      pSVar12 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&pArr->head);
      TVar1 = pSVar12->left;
      pSVar12 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&pArr->head);
      if (uVar5 <= TVar1 + pSVar12->length) goto LAB_010f1405;
    }
    if ((failFastOnError._15_1_ & 1) == 0) {
      if ((failFastOnError._14_1_ & 1) == 0) {
        CopyHeadIfInlinedHeadSegment<void*>(pArr,recycler_00);
      }
      else {
        CopyHeadIfInlinedHeadSegment<double>(pArr,recycler_00);
        pSVar12 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&pArr->head);
        ppSVar11 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                             ((WriteBarrierPtr *)&pSVar12->next);
        if (*ppSVar11 != (SparseArraySegmentBase *)0x0) {
          ReallocateNonLeafLastSegmentIfLeaf<double>(pArr,recycler_00);
        }
      }
    }
    else {
      CopyHeadIfInlinedHeadSegment<int>(pArr,recycler_00);
      pSVar12 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&pArr->head);
      ppSVar11 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                           ((WriteBarrierPtr *)&pSVar12->next);
      if (*ppSVar11 != (SparseArraySegmentBase *)0x0) {
        ReallocateNonLeafLastSegmentIfLeaf<int>(pArr,recycler_00);
      }
    }
  }
LAB_010f1405:
  ppSVar11 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                       ((WriteBarrierPtr *)&pArr->head);
  pSVar12 = *ppSVar11;
  while (_upper = pSVar12, _upper != (SparseArraySegmentBase *)0x0) {
    ppSVar11 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                         ((WriteBarrierPtr *)&_upper->next);
    pSVar12 = *ppSVar11;
    if (_upper->length != 0) {
      if ((failFastOnError._15_1_ & 1) == 0) {
        if ((failFastOnError._14_1_ & 1) == 0) {
          SparseArraySegment<void_*>::ReverseSegment
                    ((SparseArraySegment<void_*> *)_upper,recycler_00);
        }
        else {
          SparseArraySegment<double>::ReverseSegment
                    ((SparseArraySegment<double> *)_upper,recycler_00);
        }
      }
      else {
        SparseArraySegment<int>::ReverseSegment((SparseArraySegment<int> *)_upper,recycler_00);
      }
      if (uVar5 < _upper->left + _upper->length) {
        Throw::FatalInternalError(-0x7fffbffb);
      }
      _upper->left = uVar5 - (_upper->left + _upper->length);
      Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=(&_upper->next,nextSeg);
      SparseArraySegmentBase::EnsureSizeInBound(_upper);
      nextSeg = _upper;
    }
  }
  Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=(&pArr->head,nextSeg);
  if ((failFastOnError._15_1_ & 1) == 0) {
    if ((failFastOnError._14_1_ & 1) == 0) {
      EnsureHeadStartsFromZero<void*>(pArr,recycler_00);
    }
    else {
      EnsureHeadStartsFromZero<double>(pArr,recycler_00);
    }
  }
  else {
    EnsureHeadStartsFromZero<int>(pArr,recycler_00);
  }
  InvalidateLastUsedSegment(pArr);
  ClearSegmentMap(pArr);
  (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])();
  AutoDisableInterrupt::Completed((AutoDisableInterrupt *)&seg);
  AutoDisableInterrupt::~AutoDisableInterrupt((AutoDisableInterrupt *)&seg);
  pArr_local = (JavascriptArray *)obj;
LAB_010f1df4:
  JsReentLock::~JsReentLock((JsReentLock *)local_58);
  return pArr_local;
}

Assistant:

Var JavascriptArray::ReverseHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, T length, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        T middle = length / 2;
        Var lowerValue = nullptr, upperValue = nullptr;
        T lowerExists, upperExists;
        const char16* methodName;
        bool isTypedArrayEntryPoint = typedArrayBase != nullptr;

        if (isTypedArrayEntryPoint)
        {
            methodName = _u("[TypedArray].prototype.reverse");
        }
        else
        {
            methodName = _u("Array.prototype.reverse");
        }

        // If we came from Array.prototype.map and source object is not a JavascriptArray, source could be a TypedArray
        if (!isTypedArrayEntryPoint && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        ThrowTypeErrorOnFailureHelper h(scriptContext, methodName);

        bool useNoSideEffectReverse = pArr != nullptr && !HasAnyES5ArrayInPrototypeChain(pArr);

        if (useNoSideEffectReverse)
        {
            Assert(length <= JavascriptArray::MaxArrayLength);
            Recycler * recycler = scriptContext->GetRecycler();

            if (length <= 1)
            {
                return pArr;
            }

            if (pArr->IsFillFromPrototypes())
            {
                // For odd-length arrays, the middle element is unchanged,
                // so we cannot fill it from the prototypes.
                if (length % 2 == 0)
                {
                    pArr->FillFromPrototypes(0, (uint32)length);
                }
                else
                {
                    middle = length / 2;
                    pArr->FillFromPrototypes(0, (uint32)middle);
                    pArr->FillFromPrototypes(1 + (uint32)middle, (uint32)length);
                }
            }

            // As we have already established that the FillFromPrototype should not change the bound of the array.
            if (length != (T)pArr->length)
            {
                Js::Throw::FatalInternalError();
            }

            if (pArr->HasNoMissingValues() && pArr->head && pArr->head->next)
            {
                // This function currently does not track missing values in the head segment if there are multiple segments
                pArr->SetHasNoMissingValues(false);
            }

            // Above FillFromPrototypes call can change the length of the array. Our segment calculation below will
            // not work with the stale length. Update the length.
            // Note : since we are reversing the whole segment below - the functionality is not spec compliant already.
            length = pArr->length;

            SparseArraySegmentBase *prevSeg = nullptr;
            SparseArraySegmentBase *nextSeg = nullptr;

            bool isIntArray = false;
            bool isFloatArray = false;

            pArr->ClearSegmentMap(); // Just dump the segment map on reverse

            if (VarIs<JavascriptNativeIntArray>(pArr))
            {
                isIntArray = true;
            }
            else if (VarIs<JavascriptNativeFloatArray>(pArr))
            {
                isFloatArray = true;
            }

            // Code below has potential to throw due to OOM or SO. Just FailFast on those cases
            AutoDisableInterrupt failFastOnError(scriptContext->GetThreadContext());

            // During the loop below we are going to reverse the segments list. The head segment will become the last segment.
            // We have to verify that the current head segment is not the inilined segement, otherwise due to shuffling below (of EnsureHeadStartsFromZero call below), the inlined segment will no longer
            // be the head and that can create issue down the line. Create new segment if it is an inilined segment.
            if (pArr->head && (pArr->head->next || (pArr->head->left + pArr->head->length) < length))
            {
                if (isIntArray)
                {
                    CopyHeadIfInlinedHeadSegment<int32>(pArr, recycler);
                    if (pArr->head->next)
                    {
                        ReallocateNonLeafLastSegmentIfLeaf<int32>(pArr, recycler);
                    }
                }
                else if (isFloatArray)
                {
                    CopyHeadIfInlinedHeadSegment<double>(pArr, recycler);
                    if (pArr->head->next)
                    {
                        ReallocateNonLeafLastSegmentIfLeaf<double>(pArr, recycler);
                    }
                }
                else
                {
                    CopyHeadIfInlinedHeadSegment<Var>(pArr, recycler);
                }
            }

            SparseArraySegmentBase* seg = pArr->head;

            while (seg)
            {
                nextSeg = seg->next;

                // If seg.length == 0, it is possible that (seg.left + seg.length == prev.left + prev.length),
                // resulting in 2 segments sharing the same "left".
                if (seg->length > 0)
                {
                    if (isIntArray)
                    {
                        ((SparseArraySegment<int32>*)seg)->ReverseSegment(recycler);
                    }
                    else if (isFloatArray)
                    {
                        ((SparseArraySegment<double>*)seg)->ReverseSegment(recycler);
                    }
                    else
                    {
                        ((SparseArraySegment<Var>*)seg)->ReverseSegment(recycler);
                    }

                    if (((uint32)length) < (seg->left + seg->length))
                    {
                        Js::Throw::FatalInternalError();
                    }
                    seg->left = ((uint32)length) - (seg->left + seg->length);

                    seg->next = prevSeg;
                    // Make sure size doesn't overlap with next segment.
                    // An easy fix is to just truncate the size...
                    seg->EnsureSizeInBound();

                    prevSeg = seg;
                }

                seg = nextSeg;
            }

            pArr->head = prevSeg;

            if (isIntArray)
            {
                pArr->EnsureHeadStartsFromZero<int32>(recycler);
            }
            else if (isFloatArray)
            {
                pArr->EnsureHeadStartsFromZero<double>(recycler);
            }
            else
            {
                pArr->EnsureHeadStartsFromZero<Var>(recycler);
            }

            pArr->InvalidateLastUsedSegment(); // lastUsedSegment might be 0-length and discarded above
            pArr->ClearSegmentMap();
#ifdef VALIDATE_ARRAY
            pArr->ValidateArray();
#endif

            failFastOnError.Completed();
        }
        else if (typedArrayBase && length <= JavascriptArray::MaxArrayLength)
        {
            if (typedArrayBase->GetLength() == length)
            {
                // If typedArrayBase->length == length then we know that the TypedArray will have all items < length
                // and we won't have to check that the elements exist or not.
                for (uint32 lower = 0; lower < (uint32)middle; lower++)
                {
                    uint32 upper = (uint32)length - lower - 1;

                    lowerValue = typedArrayBase->DirectGetItem(lower);
                    upperValue = typedArrayBase->DirectGetItem(upper);

                    // We still have to call HasItem even though we know the TypedArray has both lower and upper because
                    // there may be a proxy handler trapping HasProperty.
                    lowerExists = typedArrayBase->HasItem(lower);
                    upperExists = typedArrayBase->HasItem(upper);

                    JS_REENTRANT(jsReentLock,
                        h.ThrowTypeErrorOnFailure(typedArrayBase->DirectSetItem(lower, upperValue)),
                        h.ThrowTypeErrorOnFailure(typedArrayBase->DirectSetItem(upper, lowerValue)));
                }
            }
            else
            {
                Assert(middle <= UINT_MAX);
                for (uint32 lower = 0; lower < (uint32)middle; lower++)
                {
                    uint32 upper = (uint32)length - lower - 1;

                    lowerValue = typedArrayBase->DirectGetItem(lower);
                    upperValue = typedArrayBase->DirectGetItem(upper);

                    lowerExists = typedArrayBase->HasItem(lower);
                    upperExists = typedArrayBase->HasItem(upper);

                    if (lowerExists)
                    {
                        if (upperExists)
                        {
                            JS_REENTRANT(jsReentLock,
                                h.ThrowTypeErrorOnFailure(typedArrayBase->DirectSetItem(lower, upperValue)),
                                h.ThrowTypeErrorOnFailure(typedArrayBase->DirectSetItem(upper, lowerValue)));
                        }
                        else
                        {
                            // This will always fail for a TypedArray if lower < length
                            h.ThrowTypeErrorOnFailure(typedArrayBase->DeleteItem(lower, PropertyOperation_ThrowOnDeleteIfNotConfig));
                            JS_REENTRANT(jsReentLock, h.ThrowTypeErrorOnFailure(typedArrayBase->DirectSetItem(upper, lowerValue)));
                        }
                    }
                    else
                    {
                        if (upperExists)
                        {
                            JS_REENTRANT(jsReentLock, h.ThrowTypeErrorOnFailure(typedArrayBase->DirectSetItem(lower, upperValue)));
                            // This will always fail for a TypedArray if upper < length
                            h.ThrowTypeErrorOnFailure(typedArrayBase->DeleteItem(upper, PropertyOperation_ThrowOnDeleteIfNotConfig));
                        }
                    }
                }
            }
        }
        else
        {
            for (T lower = 0; lower < middle; lower++)
            {
                T upper = length - lower - 1;

                JS_REENTRANT(jsReentLock,
                    lowerExists = JavascriptOperators::HasItem(obj, lower) && JavascriptOperators::GetItem(obj, lower, &lowerValue, scriptContext),
                    upperExists = JavascriptOperators::HasItem(obj, upper) && JavascriptOperators::GetItem(obj, upper, &upperValue, scriptContext));

                if (lowerExists)
                {
                    if (upperExists)
                    {
                        JS_REENTRANT(jsReentLock,
                            h.ThrowTypeErrorOnFailure(JavascriptOperators::SetItem(obj, obj, lower, upperValue, scriptContext, PropertyOperation_ThrowIfNotExtensible)),
                            h.ThrowTypeErrorOnFailure(JavascriptOperators::SetItem(obj, obj, upper, lowerValue, scriptContext, PropertyOperation_ThrowIfNotExtensible)));
                    }
                    else
                    {
                        JS_REENTRANT(jsReentLock,
                            h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(obj, lower, PropertyOperation_ThrowOnDeleteIfNotConfig)),
                            h.ThrowTypeErrorOnFailure(JavascriptOperators::SetItem(obj, obj, upper, lowerValue, scriptContext, PropertyOperation_ThrowIfNotExtensible)));
                    }
                }
                else
                {
                    if (upperExists)
                    {
                        JS_REENTRANT(jsReentLock,
                            h.ThrowTypeErrorOnFailure(JavascriptOperators::SetItem(obj, obj, lower, upperValue, scriptContext, PropertyOperation_ThrowIfNotExtensible)),
                            h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(obj, upper, PropertyOperation_ThrowOnDeleteIfNotConfig)));
                    }
                }
            }
        }

        return obj;
    }